

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O1

double find_split_dens_longform<double,double>
                 (double *x,size_t *ix_arr,size_t st,size_t end,double *split_point,size_t *split_ix
                 )

{
  long lVar1;
  long lVar2;
  size_t *psVar3;
  double dVar4;
  double dVar5;
  double __y;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long lVar8;
  double __x;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  
  if (end < st || end - st == 0) {
    dVar15 = -INFINITY;
  }
  else {
    psVar3 = ix_arr + st;
    dVar4 = x[*psVar3];
    lVar1 = (end - st) + 1;
    auVar9._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar9._0_8_ = lVar1;
    auVar9._12_4_ = 0x45300000;
    dVar5 = x[ix_arr[end]];
    dVar14 = dVar5 - dVar4;
    dVar15 = -INFINITY;
    lVar8 = 0;
    do {
      dVar12 = x[psVar3[lVar8]];
      __y = x[psVar3[lVar8 + 1]];
      if ((dVar12 != __y) || (NAN(dVar12) || NAN(__y))) {
        __x = (__y - dVar12) * 0.5 + dVar12;
        if ((__y <= __x) && ((__x = nextafter(__x,__y), __x <= dVar12 || (__y <= __x)))) {
          __x = dVar12;
        }
        auVar10._0_8_ = __x - dVar4;
        auVar10._8_8_ = dVar5 - __x;
        if (((auVar10._0_8_ != 0.0) || (NAN(auVar10._0_8_))) &&
           ((auVar10._8_8_ != 0.0 || (NAN(auVar10._8_8_))))) {
          lVar2 = lVar8 + 1;
          auVar11._8_4_ = (int)((ulong)lVar2 >> 0x20);
          auVar11._0_8_ = lVar2;
          auVar11._12_4_ = 0x45300000;
          auVar7._8_8_ = 0x10000000000000;
          auVar7._0_8_ = 0x10000000000000;
          auVar10 = maxpd(auVar10,auVar7);
          auVar6._8_8_ = dVar14;
          auVar6._0_8_ = dVar14;
          auVar10 = divpd(auVar10,auVar6);
          dVar12 = ((auVar11._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) /
                   ((auVar9._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0));
          auVar13._0_8_ = dVar12 * dVar12;
          auVar13._8_8_ = (1.0 - dVar12) * (1.0 - dVar12);
          auVar10 = divpd(auVar13,auVar10);
          dVar12 = auVar10._8_8_ + auVar10._0_8_;
          if (((!NAN(dVar12)) && (ABS(dVar12) != INFINITY)) && (dVar15 < dVar12)) {
            *split_point = __x;
            *split_ix = st + lVar8;
            dVar15 = dVar12;
          }
        }
      }
      lVar8 = lVar8 + 1;
    } while ((st - end) + lVar8 != 0);
  }
  return dVar15;
}

Assistant:

double find_split_dens_longform(real_t *restrict x, size_t *restrict ix_arr, size_t st, size_t end,
                                double &restrict split_point, size_t &restrict split_ix)
{
    double best_gain = -HUGE_VAL;
    real_t xmin = x[ix_arr[st]];
    real_t xmax = x[ix_arr[end]];
    real_t xleft, xright;
    real_t xmid;
    ldouble_safe pct_left, pct_right;
    ldouble_safe rpct_left, rpct_right;
    ldouble_safe n_tot = end - st + 1;
    ldouble_safe xtot = (ldouble_safe)xmax - (ldouble_safe)xmin;
    ldouble_safe cnt_left;
    double this_gain;

    for (size_t row = st; row < end; row++)
    {
        if (x[ix_arr[row]] == x[ix_arr[row+1]]) continue;
        xmid = midpoint(x[ix_arr[row]], x[ix_arr[row+1]]);
        xleft = xmid - xmin;
        xright = xmax - xmid;
        if (unlikely(!xleft || !xright)) continue;

        cnt_left = (ldouble_safe)(row-st+1);

        xleft = std::fmax(xleft, (real_t)std::numeric_limits<real_t>::min());
        xright = std::fmax(xright, (real_t)std::numeric_limits<real_t>::min());
        pct_left = cnt_left / n_tot;
        pct_right = (ldouble_safe)1 - pct_left;
        rpct_left = (ldouble_safe)xleft / xtot;
        rpct_right = (ldouble_safe)xright / xtot;

        this_gain = square(pct_left) / rpct_left + square(pct_right) / rpct_right;
        if (unlikely(is_na_or_inf(this_gain))) continue;
        if (this_gain > best_gain)
        {
            best_gain = this_gain;
            split_point = xmid;
            split_ix = row;
        }
    }

    return best_gain;
}